

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall
ON_RTreeIterator::PushChildren(ON_RTreeIterator *this,StackElement *sp,bool bFirstChild)

{
  bool bVar1;
  StackElement *pSVar2;
  int local_48;
  ON_RTreeNode *local_38;
  ON_RTreeNode *node;
  StackElement *spmax;
  StackElement *pSStack_20;
  bool bFirstChild_local;
  StackElement *sp_local;
  ON_RTreeIterator *this_local;
  
  local_38 = sp->m_node;
  this->m_sp = (StackElement *)0x0;
  pSStack_20 = sp;
  while( true ) {
    bVar1 = false;
    if ((local_38 != (ON_RTreeNode *)0x0) && (bVar1 = false, -1 < local_38->m_level)) {
      bVar1 = 0 < local_38->m_count;
    }
    if (!bVar1) {
      return false;
    }
    if (local_38->m_level == 0) {
      this->m_sp = pSStack_20;
      return true;
    }
    local_38 = local_38->m_branch[pSStack_20->m_branchIndex].field_1.m_child;
    pSVar2 = pSStack_20 + 1;
    if (pSVar2 == (StackElement *)&this->m_sp) break;
    pSVar2->m_node = local_38;
    if (bFirstChild) {
      local_48 = 0;
    }
    else {
      local_48 = local_38->m_count + -1;
    }
    pSStack_20[1].m_branchIndex = local_48;
    pSStack_20 = pSVar2;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_rtree.cpp"
             ,0x191,"","ON_RTreeIterator::PushFirstChild - stack overflow");
  return false;
}

Assistant:

bool ON_RTreeIterator::PushChildren(StackElement* sp, bool bFirstChild )
{ 
  StackElement* spmax = &m_stack[0] + MAX_STACK;
  const ON_RTreeNode* node = sp->m_node;
  m_sp = 0;
  // push first leaf converted by this node onto the stack
  while( 0 != node && node->m_level >= 0 && node->m_count > 0 )
  {
    if ( 0 == node->m_level )
    {
      m_sp = sp;
      return true;
    }
    node = node->m_branch[sp->m_branchIndex].m_child;
    if( ++sp == spmax )
    {
      // Either this is a GIGANTIC R-tree, or, more likely, there is
      // a bug in the code that creates the R-tree and this R-tree
      // is horribly unbalanced. If the case is valid, then we must 
      // increase MAX_STACK and ship a service release.
      ON_ERROR("ON_RTreeIterator::PushFirstChild - stack overflow");
      return false;
    }
    sp->m_node = node;
    sp->m_branchIndex = bFirstChild ? 0 : node->m_count-1; // 0 for first child
  }
  return false;
}